

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O3

string * __thiscall
jsoncons::jsonpath::detail::
parent_node_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
::to_string_abi_cxx11_(string *__return_storage_ptr__,void *this,int level)

{
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < level) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,
               (char)level * '\x02');
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  base_selector<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
  ::to_string_abi_cxx11_(&local_40,this,level + 1);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(int level) const override
        {
            std::string s;
            if (level > 0)
            {
                s.append("\n");
                s.append(std::size_t(level)*2, ' ');
            }
            s.append("parent_node_selector");
            s.append(base_selector<Json,JsonReference>::to_string(level+1));

            return s;
        }